

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessPanId
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  Value *pVVar3;
  size_type sVar4;
  const_reference pvVar5;
  element_type *peVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar7;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  anon_class_1_0_00000001 local_8b2;
  v10 local_8b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8b0;
  char *local_8a8;
  string local_8a0;
  Error local_880;
  Value local_858;
  string local_810;
  Value local_7f0;
  ErrorCode local_7a4;
  Error local_7a0;
  Value local_778;
  anon_class_1_0_00000001 local_72a;
  v10 local_729;
  v10 *local_728;
  size_t local_720;
  string local_718;
  Error local_6f8;
  Value local_6d0;
  byte local_685;
  ushort local_684;
  allocator local_681;
  undefined1 local_680 [3];
  bool conflict;
  uint16_t panId_1;
  ErrorCode local_65c;
  Error local_658;
  Value local_630;
  ErrorCode local_5e4;
  Error local_5e0;
  Value local_5b8;
  ErrorCode local_56c;
  Error local_568;
  Value local_540;
  anon_class_1_0_00000001 local_4f2;
  v10 local_4f1;
  v10 *local_4f0;
  size_t local_4e8;
  string local_4e0;
  Error local_4c0;
  Value local_498;
  ushort local_44a;
  uint local_448;
  uint16_t panId;
  uint32_t channelMask;
  anon_class_1_0_00000001 local_41a;
  v10 local_419;
  v10 *local_418;
  size_t local_410;
  string local_408;
  Error local_3e8;
  Value local_3c0;
  ErrorCode local_378 [4];
  Error local_368;
  Value local_340;
  undefined1 local_2f8 [8];
  CommissionerAppPtr commissioner;
  Expression *aExpr_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_2b0 [16];
  v10 *local_2a0;
  ulong local_298;
  v10 *local_290;
  size_t sStack_288;
  string *local_280;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_278 [3];
  undefined1 local_260 [16];
  v10 *local_250;
  ulong local_248;
  v10 *local_240;
  size_t sStack_238;
  string *local_230;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_228 [3];
  undefined1 local_210 [16];
  v10 *local_200;
  ulong local_1f8;
  v10 *local_1f0;
  size_t sStack_1e8;
  string *local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d8 [3];
  undefined1 local_1c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  char *local_1a8;
  const_reference local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  char *pcStack_190;
  string *local_188;
  v10 *local_180;
  v10 **local_178;
  v10 *local_170;
  v10 **local_168;
  v10 *local_160;
  v10 **local_158;
  v10 *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_148;
  v10 **local_140;
  v10 *local_138;
  size_t sStack_130;
  v10 **local_120;
  v10 *local_118;
  size_t sStack_110;
  v10 **local_100;
  v10 *local_f8;
  size_t sStack_f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_e0;
  undefined1 *local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_d0;
  undefined1 *local_c8;
  Value **local_c0;
  undefined1 *local_b8;
  Value **local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a0;
  Value **local_98;
  undefined8 local_90;
  undefined1 *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_80;
  undefined8 local_78;
  undefined1 *local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  Value::Value(__return_storage_ptr__);
  std::shared_ptr<ot::commissioner::CommissionerApp>::shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_2f8,(nullptr_t)0x0);
  this_00 = std::
            __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mJobManager);
  JobManager::GetSelectedCommissioner(&local_368,this_00,(CommissionerAppPtr *)local_2f8);
  Value::Value(&local_340,&local_368);
  pVVar3 = Value::operator=(__return_storage_ptr__,&local_340);
  local_378[0] = kNone;
  bVar1 = Value::operator!=(pVVar3,local_378);
  Value::~Value(&local_340);
  Error::~Error(&local_368);
  if (!bVar1) {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(aExpr);
    if (sVar4 < 2) {
      ProcessPanId::anon_class_1_0_00000001::operator()(&local_41a);
      local_178 = &local_418;
      local_180 = &local_419;
      bVar7 = ::fmt::v10::operator()(local_180);
      local_410 = bVar7.size_;
      local_418 = (v10 *)bVar7.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_1e0 = &local_408;
      local_1f0 = local_418;
      sStack_1e8 = local_410;
      local_140 = &local_1f0;
      local_200 = local_418;
      local_1f8 = local_410;
      local_138 = local_200;
      sStack_130 = local_1f8;
      local_228[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_d8 = local_210;
      local_e0 = local_228;
      local_60 = 0;
      fmt.size_ = 0;
      fmt.data_ = (char *)local_1f8;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_e0;
      local_a0 = local_e0;
      local_68 = local_e0;
      local_58 = local_d8;
      ::fmt::v10::vformat_abi_cxx11_(&local_408,local_200,fmt,args);
      Error::Error(&local_3e8,kInvalidArgs,&local_408);
      Value::Value(&local_3c0,&local_3e8);
      Value::operator=(__return_storage_ptr__,&local_3c0);
      Value::~Value(&local_3c0);
      Error::~Error(&local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](aExpr,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&channelMask,"query",(allocator *)((long)&panId + 1));
      bVar1 = CaseInsensitiveEqual(pvVar5,(string *)&channelMask);
      std::__cxx11::string::~string((string *)&channelMask);
      std::allocator<char>::~allocator((allocator<char> *)((long)&panId + 1));
      if (bVar1) {
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(aExpr);
        if (sVar4 < 5) {
          ProcessPanId::anon_class_1_0_00000001::operator()(&local_4f2);
          local_168 = &local_4f0;
          local_170 = &local_4f1;
          bVar7 = ::fmt::v10::operator()(local_170);
          local_4e8 = bVar7.size_;
          local_4f0 = (v10 *)bVar7.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_230 = &local_4e0;
          local_240 = local_4f0;
          sStack_238 = local_4e8;
          local_120 = &local_240;
          local_250 = local_4f0;
          local_248 = local_4e8;
          local_118 = local_250;
          sStack_110 = local_248;
          local_278[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
          ;
          local_c8 = local_260;
          local_d0 = local_278;
          local_78 = 0;
          fmt_00.size_ = 0;
          fmt_00.data_ = (char *)local_248;
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)local_d0;
          local_a8 = local_d0;
          local_80 = local_d0;
          local_70 = local_c8;
          ::fmt::v10::vformat_abi_cxx11_(&local_4e0,local_250,fmt_00,args_00);
          Error::Error(&local_4c0,kInvalidArgs,&local_4e0);
          Value::Value(&local_498,&local_4c0);
          Value::operator=(__return_storage_ptr__,&local_498);
          Value::~Value(&local_498);
          Error::~Error(&local_4c0);
          std::__cxx11::string::~string((string *)&local_4e0);
        }
        else {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](aExpr,2);
          utils::ParseInteger<unsigned_int>(&local_568,&local_448,pvVar5);
          Value::Value(&local_540,&local_568);
          pVVar3 = Value::operator=(__return_storage_ptr__,&local_540);
          local_56c = kNone;
          bVar1 = Value::operator!=(pVVar3,&local_56c);
          Value::~Value(&local_540);
          Error::~Error(&local_568);
          if (!bVar1) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](aExpr,3);
            utils::ParseInteger<unsigned_short>(&local_5e0,&local_44a,pvVar5);
            Value::Value(&local_5b8,&local_5e0);
            pVVar3 = Value::operator=(__return_storage_ptr__,&local_5b8);
            local_5e4 = kNone;
            bVar1 = Value::operator!=(pVVar3,&local_5e4);
            Value::~Value(&local_5b8);
            Error::~Error(&local_5e0);
            if (!bVar1) {
              peVar6 = std::
                       __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_2f8);
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](aExpr,4);
              (*(peVar6->super_CommissionerHandler)._vptr_CommissionerHandler[0x46])
                        (&local_658,peVar6,(ulong)local_448,(ulong)local_44a,pvVar5);
              Value::Value(&local_630,&local_658);
              pVVar3 = Value::operator=(__return_storage_ptr__,&local_630);
              local_65c = kNone;
              Value::operator!=(pVVar3,&local_65c);
              Value::~Value(&local_630);
              Error::~Error(&local_658);
            }
          }
        }
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](aExpr,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_680,"conflict",&local_681);
        bVar1 = CaseInsensitiveEqual(pvVar5,(string *)local_680);
        std::__cxx11::string::~string((string *)local_680);
        std::allocator<char>::~allocator((allocator<char> *)&local_681);
        if (bVar1) {
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(aExpr);
          if (sVar4 < 3) {
            ProcessPanId::anon_class_1_0_00000001::operator()(&local_72a);
            local_158 = &local_728;
            local_160 = &local_729;
            bVar7 = ::fmt::v10::operator()(local_160);
            local_720 = bVar7.size_;
            local_728 = (v10 *)bVar7.data_;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            local_280 = &local_718;
            local_290 = local_728;
            sStack_288 = local_720;
            local_100 = &local_290;
            local_2a0 = local_728;
            local_298 = local_720;
            local_f8 = local_2a0;
            sStack_f0 = local_298;
            value = (Value *)::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                       ();
            local_b8 = local_2b0;
            local_c0 = &value;
            local_90 = 0;
            fmt_01.size_ = 0;
            fmt_01.data_ = (char *)local_298;
            args_01.field_1.values_ = in_R9.values_;
            args_01.desc_ = (unsigned_long_long)local_c0;
            local_b0 = local_c0;
            local_98 = local_c0;
            local_88 = local_b8;
            ::fmt::v10::vformat_abi_cxx11_(&local_718,local_2a0,fmt_01,args_01);
            Error::Error(&local_6f8,kInvalidArgs,&local_718);
            Value::Value(&local_6d0,&local_6f8);
            Value::operator=(__return_storage_ptr__,&local_6d0);
            Value::~Value(&local_6d0);
            Error::~Error(&local_6f8);
            std::__cxx11::string::~string((string *)&local_718);
          }
          else {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](aExpr,2);
            utils::ParseInteger<unsigned_short>(&local_7a0,&local_684,pvVar5);
            Value::Value(&local_778,&local_7a0);
            pVVar3 = Value::operator=(__return_storage_ptr__,&local_778);
            local_7a4 = kNone;
            bVar1 = Value::operator!=(pVVar3,&local_7a4);
            Value::~Value(&local_778);
            Error::~Error(&local_7a0);
            if (!bVar1) {
              peVar6 = std::
                       __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_2f8);
              iVar2 = (*(peVar6->super_CommissionerHandler)._vptr_CommissionerHandler[0x47])
                                (peVar6,(ulong)local_684);
              local_685 = (byte)iVar2 & 1;
              std::__cxx11::to_string(&local_810,(uint)local_685);
              Value::Value(&local_7f0,&local_810);
              Value::operator=(__return_storage_ptr__,&local_7f0);
              Value::~Value(&local_7f0);
              std::__cxx11::string::~string((string *)&local_810);
            }
          }
        }
        else {
          ProcessPanId::anon_class_1_0_00000001::operator()(&local_8b2);
          local_148 = &local_8b0;
          local_150 = &local_8b1;
          bVar7 = ::fmt::v10::operator()(local_150);
          local_8a8 = (char *)bVar7.size_;
          local_8b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      bVar7.data_;
          ::fmt::v10::detail::
          check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                    ();
          local_1a0 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](aExpr,1);
          local_188 = &local_8a0;
          local_198 = local_8b0;
          pcStack_190 = local_8a8;
          local_50 = &local_198;
          local_1b0 = local_8b0;
          local_1a8 = local_8a8;
          local_48 = local_1b0;
          pcStack_40 = local_1a8;
          local_1d8[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                   ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)local_1a0,(v10 *)local_188,local_8b0);
          local_30 = local_1c0;
          local_38 = local_1d8;
          local_20 = 0xd;
          fmt_02.size_ = 0xd;
          fmt_02.data_ = local_1a8;
          args_02.field_1.values_ = in_R9.values_;
          args_02.desc_ = (unsigned_long_long)local_38;
          local_28 = local_38;
          local_18 = local_30;
          local_10 = local_38;
          ::fmt::v10::vformat_abi_cxx11_(&local_8a0,(v10 *)local_1b0,fmt_02,args_02);
          Error::Error(&local_880,kInvalidCommand,&local_8a0);
          Value::Value(&local_858,&local_880);
          Value::operator=(__return_storage_ptr__,&local_858);
          Value::~Value(&local_858);
          Error::~Error(&local_880);
          std::__cxx11::string::~string((string *)&local_8a0);
        }
      }
    }
  }
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 1;
  std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_2f8);
  if ((commissioner.
       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi._7_1_ & 1) == 0) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessPanId(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "query"))
    {
        uint32_t channelMask;
        uint16_t panId;
        VerifyOrExit(aExpr.size() >= 5, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(channelMask, aExpr[2]));
        SuccessOrExit(value = ParseInteger(panId, aExpr[3]));
        SuccessOrExit(value = commissioner->PanIdQuery(channelMask, panId, aExpr[4]));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "conflict"))
    {
        uint16_t panId;
        bool     conflict;
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(panId, aExpr[2]));
        conflict = commissioner->HasPanIdConflict(panId);
        value    = std::to_string(conflict);
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}